

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec_utils.c
# Opt level: O2

void apprun_chdir_to_runtime(void)

{
  undefined8 in_RAX;
  char *__path;
  
  __path = getenv("APPRUN_RUNTIME");
  if (__path != (char *)0x0) {
    chdir(__path);
    return;
  }
  fprintf(_stderr,
          "APPRUN_HOOK_WARNING: %s environment variable not set, execution of bundled binaries may fail!\n"
          ,"APPRUN_RUNTIME",in_RAX);
  return;
}

Assistant:

void apprun_chdir_to_runtime() {
    char const* runtime_path = getenv(APPRUN_ENV_RUNTIME);
    if (runtime_path != NULL) {
        chdir(runtime_path);
    } else {
        fprintf(stderr,
                "APPRUN_HOOK_WARNING: %s environment variable not set, execution of bundled binaries may fail!\n",
                APPRUN_ENV_RUNTIME);
    }
}